

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void __thiscall google::LogMessage::SendToSyslogAndLog(LogMessage *this)

{
  LogMessageData *pLVar1;
  char *__ident;
  
  if (SendToSyslogAndLog()::openlog_already_called == '\0') {
    __ident = glog_internal_namespace_::ProgramInvocationShortName();
    openlog(__ident,0xb,8);
    SendToSyslogAndLog()::openlog_already_called = '\x01';
  }
  pLVar1 = this->data_;
  syslog(*(uint *)(&DAT_00123700 + (long)(int)pLVar1->severity_ * 4) | 8,"%.*s",
         (ulong)(uint)pLVar1->num_chars_to_syslog_,pLVar1->message_text_ + pLVar1->num_prefix_chars_
        );
  SendToLog(this);
  return;
}

Assistant:

void LogMessage::SendToSyslogAndLog() {
#ifdef HAVE_SYSLOG_H
  // Before any calls to syslog(), make a single call to openlog()
  static bool openlog_already_called = false;
  if (!openlog_already_called) {
    openlog(glog_internal_namespace_::ProgramInvocationShortName(),
            LOG_CONS | LOG_NDELAY | LOG_PID, LOG_USER);
    openlog_already_called = true;
  }

  // This array maps Google severity levels to syslog levels
  const int SEVERITY_TO_LEVEL[] = {LOG_INFO, LOG_WARNING, LOG_ERR, LOG_EMERG};
  syslog(LOG_USER | SEVERITY_TO_LEVEL[static_cast<int>(data_->severity_)],
         "%.*s", static_cast<int>(data_->num_chars_to_syslog_),
         data_->message_text_ + data_->num_prefix_chars_);
  SendToLog();
#else
  LOG(ERROR) << "No syslog support: message=" << data_->message_text_;
#endif
}